

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O0

string * (anonymous_namespace)::extToString_abi_cxx11_(Extrapolation ext)

{
  undefined4 in_ESI;
  string *in_RDI;
  string *str;
  
  std::__cxx11::string::string((string *)in_RDI);
  switch(in_ESI) {
  case 0:
    std::__cxx11::string::operator=((string *)in_RDI,"black");
    break;
  case 1:
    std::__cxx11::string::operator=((string *)in_RDI,"clamp");
    break;
  case 2:
    std::__cxx11::string::operator=((string *)in_RDI,"periodic");
    break;
  case 3:
    std::__cxx11::string::operator=((string *)in_RDI,"mirror");
  }
  return in_RDI;
}

Assistant:

string
extToString (Extrapolation ext)
{
    string str;

    switch (ext)
    {
        case BLACK: str = "black"; break;

        case CLAMP: str = "clamp"; break;

        case PERIODIC: str = "periodic"; break;

        case MIRROR: str = "mirror"; break;
    }

    return str;
}